

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void coins_tests::GetCoinsMapEntry(CCoinsMap *map,CAmount *value,char *flags,COutPoint *outp)

{
  long lVar1;
  bool bVar2;
  uint8_t uVar3;
  pointer pvVar4;
  CCoinsCacheEntry *in_RCX;
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  *in_RDX;
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> *in_RSI;
  long in_FS_OFFSET;
  const_iterator it;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::find(in_RDX,(key_type *)in_RCX);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::end(in_RDX);
  bVar2 = std::__detail::operator==
                    (in_RSI,(_Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                             *)in_RDX);
  if (bVar2) {
    in_RSI->_M_cur = (__node_type *)0xfffffffffffffffe;
    *(undefined1 *)
     &(in_RDX->_M_h).
      super__Hashtable_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      .
      super__Hash_code_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::__detail::_Select1st,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
      .super__Hashtable_ebo_helper<1,_SaltedOutpointHasher,_false>._M_tp.k0 = 0xff;
  }
  else {
    std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
    ::operator->((_Node_const_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *
                 )in_RCX);
    bVar2 = Coin::IsSpent((Coin *)in_RCX);
    if (bVar2) {
      in_RSI->_M_cur = (__node_type *)0xffffffffffffffff;
    }
    else {
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>::
               operator->((_Node_const_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
                           *)in_RCX);
      in_RSI->_M_cur = (__node_type *)(pvVar4->second).coin.out.nValue;
    }
    std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>
    ::operator->((_Node_const_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> *
                 )in_RCX);
    uVar3 = CCoinsCacheEntry::GetFlags(in_RCX);
    *(uint8_t *)
     &(in_RDX->_M_h).
      super__Hashtable_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      .
      super__Hash_code_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::__detail::_Select1st,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
      .super__Hashtable_ebo_helper<1,_SaltedOutpointHasher,_false>._M_tp.k0 = uVar3;
    if ((char)(in_RDX->_M_h).
              super__Hashtable_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              .
              super__Hash_code_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::__detail::_Select1st,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_false>
              .super__Hashtable_ebo_helper<1,_SaltedOutpointHasher,_false>._M_tp.k0 == -1) {
      __assert_fail("flags != NO_ENTRY",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
                    ,0x26c,
                    "void coins_tests::GetCoinsMapEntry(const CCoinsMap &, CAmount &, char &, const COutPoint &)"
                   );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void GetCoinsMapEntry(const CCoinsMap& map, CAmount& value, char& flags, const COutPoint& outp = OUTPOINT)
{
    auto it = map.find(outp);
    if (it == map.end()) {
        value = ABSENT;
        flags = NO_ENTRY;
    } else {
        if (it->second.coin.IsSpent()) {
            value = SPENT;
        } else {
            value = it->second.coin.out.nValue;
        }
        flags = it->second.GetFlags();
        assert(flags != NO_ENTRY);
    }
}